

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map_types.cpp
# Opt level: O2

pair<std::shared_ptr<const_pstore::index::details::internal_node>,_const_pstore::index::details::internal_node_*>
* pstore::index::details::internal_node::get_node
            (pair<std::shared_ptr<const_pstore::index::details::internal_node>,_const_pstore::index::details::internal_node_*>
             *__return_storage_ptr__,database *db,index_pointer node)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  typed_address<pstore::index::details::internal_node> addr;
  signature_type sVar2;
  shared_ptr<const_pstore::index::details::internal_node> store_internal;
  index_pointer local_30;
  signature_type local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  if (((ulong)node.internal_ & 2) == 0) {
    local_30 = node;
    addr = index_pointer::untag_address<pstore::index::details::internal_node,void>
                     ((index_pointer *)&local_30.addr_);
    read_node((internal_node *)&local_28,db,addr);
    _Var1._M_pi = local_20._M_pi;
    sVar2._M_elems = local_28._M_elems;
    (__return_storage_ptr__->first).
    super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)local_28._M_elems;
    local_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__return_storage_ptr__->first).
    super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Var1._M_pi;
    local_28._M_elems[0] = '\0';
    local_28._M_elems[1] = '\0';
    local_28._M_elems[2] = '\0';
    local_28._M_elems[3] = '\0';
    local_28._M_elems[4] = '\0';
    local_28._M_elems[5] = '\0';
    local_28._M_elems[6] = '\0';
    local_28._M_elems[7] = '\0';
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
  }
  else {
    sVar2._M_elems = (_Type)((ulong)node.internal_ & 0xfffffffffffffffc);
    (__return_storage_ptr__->first).
    super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    (__return_storage_ptr__->first).
    super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  __return_storage_ptr__->second = (internal_node *)sVar2._M_elems;
  return __return_storage_ptr__;
}

Assistant:

auto internal_node::get_node (database const & db, index_pointer const node)
                -> std::pair<std::shared_ptr<internal_node const>, internal_node const *> {

                if (node.is_heap ()) {
                    return {nullptr, node.untag<internal_node *> ()};
                }

                std::shared_ptr<internal_node const> store_internal =
                    internal_node::read_node (db, node.untag_address<internal_node> ());
                auto const * const p = store_internal.get ();
                return {std::move (store_internal), p};
            }